

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O2

uint64 mkvmuxer::WriteFrame(IMkvWriter *writer,Frame *frame,Cluster *cluster)

{
  uint64 value;
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  bool bVar4;
  int32 iVar5;
  int iVar6;
  uint uVar7;
  ulong value_00;
  ulong value_01;
  uint64 uVar8;
  uint64 uVar9;
  uint64 uVar10;
  uint64 uVar11;
  uint64 local_70;
  uint64 local_68;
  long local_60;
  
  if (((frame != (Frame *)0x0 && writer != (IMkvWriter *)0x0) &&
      (bVar4 = Frame::IsValid(frame), cluster != (Cluster *)0x0 && bVar4)) &&
     (cluster->timecode_scale_ != 0)) {
    value_00 = Cluster::GetRelativeTimecode(cluster,frame->timestamp_ / cluster->timecode_scale_);
    if (0x7fff < value_00) {
      return 0;
    }
    bVar4 = Frame::CanBeSimpleBlock(frame);
    if (bVar4) {
      iVar5 = WriteID(writer,0xa3);
      if (iVar5 == 0) {
        uVar11 = (uint64)((int)frame->length_ + 4);
        iVar5 = WriteUInt(writer,uVar11);
        if ((((iVar5 == 0) && (iVar5 = WriteUInt(writer,frame->track_number_), iVar5 == 0)) &&
            (iVar5 = SerializeInt(writer,value_00,2), iVar5 == 0)) &&
           ((iVar5 = SerializeInt(writer,(ulong)frame->is_key_ << 7,1), iVar5 == 0 &&
            (iVar6 = (**writer->_vptr_IMkvWriter)(writer,frame->frame_,(ulong)(uint)frame->length_),
            iVar6 == 0)))) {
          uVar7 = GetCodedUIntSize(uVar11);
          return (ulong)uVar7 + frame->length_ + 5;
        }
      }
    }
    else {
      uVar1 = cluster->timecode_scale_;
      if (frame->additional_ == (uint8 *)0x0) {
        local_68 = 0;
        local_60 = 0;
        local_70 = 0;
      }
      else {
        uVar11 = EbmlElementSize(0xa5,frame->additional_,frame->additional_length_);
        local_70 = EbmlElementSize(0xee,frame->add_id_);
        local_70 = local_70 + uVar11;
        local_68 = EbmlMasterElementSize(0xa6,local_70);
        local_68 = local_68 + local_70;
        uVar11 = EbmlMasterElementSize(0x75a1,local_68);
        local_60 = uVar11 + local_68;
      }
      if (frame->discard_padding_ == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = EbmlElementSize(0x75a2,frame->discard_padding_);
      }
      uVar8 = 0;
      value_01 = (ulong)frame->reference_block_timestamp_ / uVar1;
      if (frame->is_key_ == false) {
        uVar8 = EbmlElementSize(0xfb,value_01);
      }
      uVar2 = frame->duration_;
      uVar9 = 0;
      if (uVar1 <= uVar2) {
        uVar9 = EbmlElementSize(0x9b,uVar2 / uVar1);
      }
      uVar3 = frame->length_;
      value = uVar3 + 4;
      uVar10 = EbmlMasterElementSize(0xa1,value);
      uVar10 = uVar3 + uVar11 + local_60 + uVar8 + uVar9 + 4 + uVar10;
      bVar4 = WriteEbmlMasterElement(writer,0xa0,uVar10);
      if (((bVar4) && (bVar4 = WriteEbmlMasterElement(writer,0xa1,value), bVar4)) &&
         ((iVar5 = WriteUInt(writer,frame->track_number_), iVar5 == 0 &&
          (iVar5 = SerializeInt(writer,value_00,2), iVar5 == 0)))) {
        iVar5 = SerializeInt(writer,0,1);
        if (iVar5 != 0) {
          return 0;
        }
        iVar6 = (**writer->_vptr_IMkvWriter)(writer,frame->frame_,(ulong)(uint)frame->length_);
        if ((iVar6 == 0) &&
           (((frame->additional_ == (uint8_t *)0x0 ||
             (((bVar4 = WriteEbmlMasterElement(writer,0x75a1,local_68), bVar4 &&
               (bVar4 = WriteEbmlMasterElement(writer,0xa6,local_70), bVar4)) &&
              ((bVar4 = WriteEbmlElement(writer,0xee,frame->add_id_), bVar4 &&
               (bVar4 = WriteEbmlElement(writer,0xa5,frame->additional_,frame->additional_length_),
               bVar4)))))) &&
            (((frame->discard_padding_ == 0 ||
              (bVar4 = WriteEbmlElement(writer,0x75a2,frame->discard_padding_), bVar4)) &&
             (((frame->is_key_ != false || (bVar4 = WriteEbmlElement(writer,0xfb,value_01), bVar4))
              && ((uVar2 < uVar1 || (bVar4 = WriteEbmlElement(writer,0x9b,uVar2 / uVar1), bVar4)))))
             ))))) {
          uVar11 = EbmlMasterElementSize(0xa0,uVar10);
          return uVar11 + uVar10;
        }
      }
    }
  }
  return 0;
}

Assistant:

uint64 WriteFrame(IMkvWriter* writer, const Frame* const frame,
                  Cluster* cluster) {
  if (!writer || !frame || !frame->IsValid() || !cluster ||
      !cluster->timecode_scale())
    return 0;

  //  Technically the timecode for a block can be less than the
  //  timecode for the cluster itself (remember that block timecode
  //  is a signed, 16-bit integer).  However, as a simplification we
  //  only permit non-negative cluster-relative timecodes for blocks.
  const int64 relative_timecode = cluster->GetRelativeTimecode(
      frame->timestamp() / cluster->timecode_scale());
  if (relative_timecode < 0 || relative_timecode > kMaxBlockTimecode)
    return 0;

  return frame->CanBeSimpleBlock()
             ? WriteSimpleBlock(writer, frame, relative_timecode)
             : WriteBlock(writer, frame, relative_timecode,
                          cluster->timecode_scale());
}